

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void __thiscall snestistics::LargeBitfield::read_file(LargeBitfield *this,BigFile *f)

{
  uint uVar1;
  uint in_EAX;
  size_t sVar2;
  uint32_t *__ptr;
  ulong uVar3;
  uint32_t new_size;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  sVar2 = fread((void *)((long)&uStack_28 + 4),1,4,(FILE *)f->_file);
  f->_offset = f->_offset + sVar2;
  BigFile::validate(f);
  uVar1 = uStack_28._4_4_;
  uVar3 = (ulong)uStack_28._4_4_;
  __ptr = this->_state;
  if (uStack_28._4_4_ != this->_num_elements) {
    if (__ptr != (uint32_t *)0x0) {
      operator_delete__(__ptr);
    }
    __ptr = (uint32_t *)operator_new__(uVar3 * 4);
    this->_state = __ptr;
    this->_num_elements = uVar1;
  }
  sVar2 = fread(__ptr,1,uVar3 * 4,(FILE *)f->_file);
  f->_offset = f->_offset + sVar2;
  BigFile::validate(f);
  return;
}

Assistant:

void LargeBitfield::read_file(BigFile &f) {
	uint32_t new_size = 0;
	f.read(new_size);

	if (new_size != _num_elements) {
		delete[] _state;
		_state = new uint32_t[new_size];
		_num_elements = new_size;
	}

	f.read(_state, sizeof(uint32_t)*new_size);
}